

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

CMConnection Tunneling_get_conn(CManager cm,attr_list attrs)

{
  int iVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  hostent *phVar4;
  ssize_t sVar5;
  CMConnection p_Var6;
  int iVar7;
  long lVar8;
  in_addr_t iVar9;
  size_t sStackY_da0;
  int DestinationIP;
  char *DestinationHostStr;
  int DestinationPort;
  CManager local_d70;
  char *group_id;
  int forward_port;
  char IPstr [16];
  anon_union_16_2_c960cb83 sock_addr;
  char msg [256];
  char request [1024];
  char recv_buffer [2048];
  
  group_id = (char *)0x0;
  iVar1 = get_string_attr(attrs);
  if (iVar1 == 0) goto LAB_006c32bc;
  memset(request,0,0x400);
  iVar1 = get_int_attr(attrs,IP_PORT_ATOM,&DestinationPort);
  if (iVar1 == 0) {
    pcVar3 = "No IP_PORT atom\n";
    sStackY_da0 = 0x10;
LAB_006c3329:
    fwrite(pcVar3,sStackY_da0,1,_stderr);
  }
  else {
    iVar1 = get_int_attr(attrs,IP_ADDR_ATOM,&DestinationIP);
    if (iVar1 == 0) {
      DestinationIP = 0;
    }
    iVar1 = get_string_attr(attrs,IP_HOST_ATOM,&DestinationHostStr);
    if (iVar1 == 0) {
      fwrite("No IP_HOST",10,1,_stderr);
      DestinationHostStr = (char *)0x0;
      if (DestinationIP == 0) goto LAB_006c3316;
LAB_006c309b:
      inet_ntop(2,&DestinationIP,IPstr,0x10);
      DestinationHostStr = IPstr;
    }
    else {
      if ((DestinationHostStr == (char *)0x0) && (DestinationIP == 0)) {
LAB_006c3316:
        pcVar3 = "NO IP or Hostname for tunnel\n";
        sStackY_da0 = 0x1d;
        goto LAB_006c3329;
      }
      if (DestinationHostStr == (char *)0x0) goto LAB_006c309b;
    }
    iVar1 = snprintf(request,0x400,"/connect_port?group=%s&service=%s&dhost=%s&dport=%d",group_id,
                     "service_5",DestinationHostStr,DestinationPort);
    pcVar3 = getenv("TUNNEL_SERVER_HOST");
    if (pcVar3 == (char *)0x0) {
      iVar9 = 0x7f000001;
    }
    else {
      phVar4 = gethostbyname(pcVar3);
      if (phVar4 == (hostent *)0x0) {
        iVar9 = inet_addr(pcVar3);
        if (iVar9 == 0xffffffff) {
          return (CMConnection)0x0;
        }
      }
      else {
        memcpy(recv_buffer,*phVar4->h_addr_list,(long)phVar4->h_length);
        iVar9 = (uint)recv_buffer._0_4_ >> 0x18 | (recv_buffer._0_4_ & 0xff0000) >> 8 |
                (recv_buffer._0_4_ & 0xff00) << 8 | recv_buffer._0_4_ << 0x18;
      }
    }
    sock_addr._0_4_ = 0x30750002;
    sock_addr.s_I4.sin_addr.s_addr =
         (in_addr)(iVar9 >> 0x18 | (iVar9 & 0xff0000) >> 8 | (iVar9 & 0xff00) << 8 | iVar9 << 0x18);
    iVar7 = 0;
    local_d70 = cm;
    __fd = socket(2,1,0);
    iVar2 = connect(__fd,(sockaddr *)&sock_addr.s,0x10);
    if (iVar2 != -1) {
      printf("Request is \"%s\"\n",request);
      for (; iVar1 - iVar7 != 0 && iVar7 <= iVar1; iVar7 = iVar7 + (int)sVar5) {
        sVar5 = write(__fd,request + iVar7,(long)(iVar1 - iVar7));
        if ((int)sVar5 == -1) {
          puts("Error");
        }
      }
      lVar8 = 0;
      do {
        sVar5 = read(__fd,recv_buffer + lVar8,(long)(0x800 - (int)lVar8));
        iVar1 = (int)sVar5;
        if (iVar1 == -1) {
          puts("Error");
        }
        else if (iVar1 == 0) goto LAB_006c322d;
        lVar8 = lVar8 + iVar1;
      } while( true );
    }
    puts("connect Error");
  }
  return (CMConnection)0x0;
LAB_006c322d:
  close(__fd);
  printf("We got %s from the tunnel server\n",recv_buffer);
  __isoc99_sscanf(recv_buffer,"port:%d,msg:%s",&forward_port,msg);
  printf("Forward port is %d\n",(ulong)(uint)forward_port);
  attrs = (attr_list)create_attr_list();
  add_attr(attrs,IP_PORT_ATOM,1,(long)forward_port);
  add_attr(attrs,IP_ADDR_ATOM,1,(long)(int)iVar9);
  cm = local_d70;
LAB_006c32bc:
  p_Var6 = (CMConnection)CMget_conn(cm,attrs);
  return p_Var6;
}

Assistant:

CMConnection Tunneling_get_conn(CManager cm, attr_list attrs)
{
    char *group_id = NULL;
    if (get_string_attr(attrs, SST_GROUP_ID_ATOM, &group_id))
    {
        attr_list conn_attrs;
        // do the tunneling
        char request[1024] = {'\0'};
        const char *format_string = "/connect_port?group=%s&service=%s&dhost=%s&dport=%d";
        int DestinationIP;
        int DestinationPort;
        char *DestinationHostStr;
        if (!get_int_attr(attrs, IP_PORT_ATOM, &DestinationPort))
        {
            fprintf(stderr, "No IP_PORT atom\n");
            return NULL;
        }
        if (!get_int_attr(attrs, IP_ADDR_ATOM, &DestinationIP))
        {
            DestinationIP = 0;
        }
        if (!get_string_attr(attrs, IP_HOST_ATOM, &DestinationHostStr))
        {
            fprintf(stderr, "No IP_HOST");
            DestinationHostStr = NULL;
        }
        char IPstr[INET_ADDRSTRLEN];
        if ((DestinationHostStr == NULL) && (DestinationIP == 0))
        {
            fprintf(stderr, "NO IP or Hostname for tunnel\n");
            return NULL;
        }
        else if (DestinationHostStr == NULL)
        {
            inet_ntop(AF_INET, &DestinationIP, IPstr, INET_ADDRSTRLEN);
            DestinationHostStr = &IPstr[0];
        }
        int request_len = snprintf(request, sizeof(request), format_string, group_id, "service_5",
                                   DestinationHostStr, DestinationPort);
        union
        {
            struct sockaddr s;
            struct sockaddr_in s_I4;
        } sock_addr;

        int server_addr = INADDR_LOOPBACK;
        char *server_hostname = getenv("TUNNEL_SERVER_HOST");
        if (server_hostname)
        {
            struct hostent *host_addr;
            host_addr = gethostbyname(server_hostname);
            if (host_addr == NULL)
            {
                int _addr;
                _addr = inet_addr(server_hostname);
                if (_addr == -1)
                {
                    /*
                     *  not translatable as a hostname or
                     * as a dot-style string IP address
                     */
                    return 0;
                }
                if (sizeof(int) == sizeof(struct in_addr))
                    server_addr = (int)_addr;
                else
                {
                    printf("Bad struct size\n");
                    return NULL;
                }
            }
            else
            {
                int tmp;
                memcpy(&tmp, host_addr->h_addr, host_addr->h_length);
                server_addr = ntohl(tmp);
            }
        }
        sock_addr.s_I4.sin_family = AF_INET;
        sock_addr.s_I4.sin_addr.s_addr = htonl(server_addr);
        sock_addr.s_I4.sin_port = htons(30000);

        int sock = socket(AF_INET, SOCK_STREAM, 0);
        /* Actually connect. */
        if (connect(sock, (struct sockaddr *)&sock_addr.s_I4, sizeof(sock_addr)) == -1)
        {
            printf("connect Error\n");
            return NULL;
        }

        /* Send request. */
        printf("Request is \"%s\"\n", request);
        int nbytes_total = 0;
        while (nbytes_total < request_len)
        {
            int nbytes_last = write(sock, request + nbytes_total, request_len - nbytes_total);
            if (nbytes_last == -1)
                printf("Error\n");
            nbytes_total += nbytes_last;
        }

        /* Read the response. */
        size_t bytes_recd = 0;
        char recv_buffer[2048];
        while (1)
        {
            size_t remaining = sizeof(recv_buffer) - bytes_recd;
            int read_len = remaining;
            nbytes_total = read(sock, recv_buffer + bytes_recd, read_len);
            if (nbytes_total == 0)
            {
                break;
            }
            if (nbytes_total == -1)
            {
                printf("Error\n");
            }
            bytes_recd += nbytes_total;
        }

        close(sock);
        printf("We got %s from the tunnel server\n", recv_buffer);
        char msg[256];
        int forward_port;
        sscanf(recv_buffer, "port:%d,msg:%s", &forward_port, &msg[0]);
        printf("Forward port is %d\n", forward_port);
        conn_attrs = create_attr_list();
        add_attr(conn_attrs, IP_PORT_ATOM, Attr_Int4, (attr_value)(intptr_t)forward_port);

        add_attr(conn_attrs, IP_ADDR_ATOM, Attr_Int4, (attr_value)server_addr);

        return CMget_conn(cm, conn_attrs);
    }
    else
    {
        return CMget_conn(cm, attrs);
    }
}